

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generators.cpp
# Opt level: O3

Matrix3d * opengv::generateRandomRotation(void)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ActualDstType actualDst;
  Matrix3d *in_RDI;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar18 [64];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  Matrix3d R2;
  Matrix3d R1;
  double adStack_118 [5];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  double local_d8;
  double local_d0 [7];
  double local_98;
  undefined8 local_90;
  undefined8 local_88;
  double local_80;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  double local_38;
  undefined1 extraout_var [56];
  
  iVar8 = rand();
  iVar9 = rand();
  iVar10 = rand();
  local_90 = 0;
  adStack_118[1] = ((double)iVar8 / 2147483647.0 + -0.5) * 6.283185307179586;
  dVar15 = ((double)iVar9 / 2147483647.0 + -0.5) * 3.141592653589793;
  dVar19 = ((double)iVar10 / 2147483647.0 + -0.5) * 6.283185307179586;
  dVar14 = cos(adStack_118[1]);
  local_d0[6] = dVar14;
  local_98 = sin(adStack_118[1]);
  auVar12._0_8_ = -local_98;
  auVar12._8_4_ = (int)extraout_XMM0_Qb;
  auVar12._12_4_ = (uint)((ulong)extraout_XMM0_Qb >> 0x20) ^ 0x80000000;
  local_88 = vmovlps_avx(auVar12);
  local_d0[2] = 1.0;
  local_d0[3] = 0.0;
  local_d0[4] = 0.0;
  local_d0[5] = 0.0;
  local_80 = dVar14;
  dVar14 = cos(dVar15);
  adStack_118[2] = dVar14;
  local_d8 = sin(dVar15);
  local_f0 = vmovhps_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  auVar16._0_8_ = -local_d8;
  auVar16._8_4_ = (undefined4)extraout_XMM0_Qb_00;
  auVar16._12_4_ = (uint)((ulong)extraout_XMM0_Qb_00 >> 0x20) ^ 0x80000000;
  adStack_118[3] = 0.0;
  local_d0[0] = 0.0;
  adStack_118[4] = (double)vmovlps_avx(auVar16);
  local_e0 = 0;
  local_d0[1] = dVar14;
  dVar15 = cos(dVar19);
  auVar18._0_8_ = sin(dVar19);
  auVar18._8_56_ = extraout_var;
  auVar20._0_8_ = -auVar18._0_8_;
  auVar20._8_8_ = extraout_var._0_8_ ^ 0x8000000000000000;
  auVar13._8_8_ = extraout_XMM0_Qb_01;
  auVar13._0_8_ = dVar15;
  lVar11 = 0x10;
  auVar16 = vunpcklpd_avx(auVar13,auVar18._0_16_);
  auVar13 = vunpcklpd_avx(auVar20,auVar13);
  do {
    auVar2._8_8_ = *(undefined8 *)((long)adStack_118 + lVar11);
    auVar2._0_8_ = *(undefined8 *)((long)adStack_118 + lVar11);
    auVar12 = vmulpd_avx512vl(auVar16,auVar2);
    dVar15 = *(double *)((long)adStack_118 + lVar11 + 0x10);
    auVar24._8_8_ = dVar15;
    auVar24._0_8_ = dVar15;
    uVar1 = *(undefined8 *)((long)adStack_118 + lVar11 + 8);
    auVar3._8_8_ = uVar1;
    auVar3._0_8_ = uVar1;
    auVar12 = vfmadd231pd_avx512vl(auVar12,auVar13,auVar3);
    auVar12 = vfmadd231pd_fma(auVar12,auVar24,ZEXT816(0) << 0x40);
    *(undefined1 (*) [16])((long)&local_88 + lVar11) = auVar12;
    auVar26._0_8_ = *(double *)((long)adStack_118 + lVar11) * 0.0;
    auVar26._8_8_ = *(double *)((long)adStack_118 + lVar11 + 8) * 0.0;
    auVar12 = vshufpd_avx(auVar26,auVar26,1);
    *(double *)(local_78 + lVar11) = auVar26._0_8_ + auVar12._0_8_ + dVar15;
    lVar11 = lVar11 + 0x18;
  } while (lVar11 != 0x58);
  auVar6._8_8_ = uStack_60;
  auVar6._0_8_ = local_68;
  auVar7._8_8_ = uStack_58;
  auVar7._0_8_ = uStack_60;
  lVar11 = 0x10;
  auVar16 = vmovhpd_avx(auVar6,local_50);
  do {
    auVar4._8_8_ = *(undefined8 *)((long)local_d0 + lVar11);
    auVar4._0_8_ = *(undefined8 *)((long)local_d0 + lVar11);
    auVar13 = vmulpd_avx512vl(local_78,auVar4);
    dVar15 = *(double *)((long)local_d0 + lVar11 + 0x10);
    auVar34._8_8_ = dVar15;
    auVar34._0_8_ = dVar15;
    auVar40._0_8_ = auVar16._0_8_ * *(double *)((long)local_d0 + lVar11);
    auVar40._8_8_ = auVar16._8_8_ * *(double *)((long)local_d0 + lVar11 + 8);
    uVar1 = *(undefined8 *)((long)local_d0 + lVar11 + 8);
    auVar5._8_8_ = uVar1;
    auVar5._0_8_ = uVar1;
    auVar13 = vfmadd231pd_avx512vl(auVar13,auVar7,auVar5);
    auVar13 = vfmadd231pd_fma(auVar13,local_48,auVar34);
    *(undefined1 (*) [16])
     ((long)(in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array + lVar11 + -0x10) = auVar13;
    auVar13 = vshufpd_avx(auVar40,auVar40,1);
    *(double *)
     ((long)(in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array + lVar11) = auVar40._0_8_ + auVar13._0_8_ + local_38 * dVar15;
    lVar11 = lVar11 + 0x18;
  } while (lVar11 != 0x58);
  auVar16 = *(undefined1 (*) [16])
             (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
             .array;
  dVar15 = (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[2];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar15 * dVar15 + auVar16._0_8_ * auVar16._0_8_ + auVar16._8_8_ * auVar16._8_8_;
  auVar13 = vsqrtpd_avx(auVar21);
  dVar19 = auVar13._0_8_;
  auVar27._8_8_ = dVar19;
  auVar27._0_8_ = dVar19;
  auVar22._0_8_ = dVar15 / dVar19;
  auVar22._8_8_ = 0;
  auVar16 = vdivpd_avx(auVar16,auVar27);
  *(undefined1 (*) [16])
   (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array =
       auVar16;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       auVar22._0_8_;
  auVar12 = vshufpd_avx(auVar16,auVar16,1);
  dVar15 = (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[4];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar15;
  dVar19 = (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[5];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar19;
  dVar14 = (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[3];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar14;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar15 * auVar22._0_8_;
  auVar13 = vfmsub231sd_fma(auVar35,auVar12,auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar19 * auVar16._0_8_;
  auVar20 = vfmsub231sd_fma(auVar29,auVar22,auVar37);
  auVar20 = vunpcklpd_avx(auVar13,auVar20);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar14 * auVar12._0_8_;
  auVar2 = vfmsub231sd_fma(auVar36,auVar16,auVar31);
  dVar19 = auVar2._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar19 * dVar19 + auVar20._0_8_ * auVar20._0_8_ + auVar20._8_8_ * auVar20._8_8_;
  auVar13 = vsqrtpd_avx(auVar32);
  dVar15 = auVar13._0_8_;
  auVar38._8_8_ = dVar15;
  auVar38._0_8_ = dVar15;
  auVar33._0_8_ = dVar19 / dVar15;
  auVar33._8_8_ = auVar2._8_8_;
  auVar13 = vdivpd_avx(auVar20,auVar38);
  auVar20 = vshufpd_avx(auVar13,auVar13,1);
  *(undefined1 (*) [16])
   ((in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
   6) = auVar13;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       auVar33._0_8_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = auVar12._0_8_ * auVar33._0_8_;
  auVar2 = vfmsub231sd_fma(auVar39,auVar20,auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = auVar22._0_8_ * auVar13._0_8_;
  auVar3 = vfmsub231sd_fma(auVar23,auVar16,auVar33);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = auVar16._0_8_ * auVar20._0_8_;
  auVar16 = vfmsub231sd_fma(auVar17,auVar13,auVar12);
  auVar13 = vunpcklpd_avx(auVar2,auVar3);
  dVar15 = auVar16._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar15 * dVar15 + auVar13._0_8_ * auVar13._0_8_ + auVar13._8_8_ * auVar13._8_8_;
  auVar16 = vsqrtpd_avx(auVar25);
  dVar19 = auVar16._0_8_;
  auVar30._8_8_ = dVar19;
  auVar30._0_8_ = dVar19;
  auVar16 = vdivpd_avx(auVar13,auVar30);
  *(undefined1 (*) [16])
   ((in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
   3) = auVar16;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
       dVar15 / dVar19;
  return in_RDI;
}

Assistant:

Eigen::Matrix3d
opengv::generateRandomRotation()
{
  Eigen::Vector3d rpy;
  rpy[0] = ((double) rand())/ ((double) RAND_MAX);
  rpy[1] = ((double) rand())/ ((double) RAND_MAX);
  rpy[2] = ((double) rand())/ ((double) RAND_MAX);

  rpy[0] = 2*M_PI*(rpy[0]-0.5);
  rpy[1] = M_PI*(rpy[1]-0.5);
  rpy[2] = 2*M_PI*(rpy[2]-0.5);

  Matrix3d R1;
  R1(0,0) = 1.0;
  R1(0,1) = 0.0;
  R1(0,2) = 0.0;
  R1(1,0) = 0.0;
  R1(1,1) = cos(rpy[0]);
  R1(1,2) = -sin(rpy[0]);
  R1(2,0) = 0.0;
  R1(2,1) = -R1(1,2);
  R1(2,2) = R1(1,1);

  Matrix3d R2;
  R2(0,0) = cos(rpy[1]);
  R2(0,1) = 0.0;
  R2(0,2) = sin(rpy[1]);
  R2(1,0) = 0.0;
  R2(1,1) = 1.0;
  R2(1,2) = 0.0;
  R2(2,0) = -R2(0,2);
  R2(2,1) = 0.0;
  R2(2,2) = R2(0,0);

  Matrix3d R3;
  R3(0,0) = cos(rpy[2]);
  R3(0,1) = -sin(rpy[2]);
  R3(0,2) = 0.0;
  R3(1,0) =-R3(0,1);
  R3(1,1) = R3(0,0);
  R3(1,2) = 0.0;
  R3(2,0) = 0.0;
  R3(2,1) = 0.0;
  R3(2,2) = 1.0;

  Matrix3d rotation = R3 * R2 * R1;

  rotation.col(0) = rotation.col(0) / rotation.col(0).norm();
  rotation.col(2) = rotation.col(0).cross(rotation.col(1));
  rotation.col(2) = rotation.col(2) / rotation.col(2).norm();
  rotation.col(1) = rotation.col(2).cross(rotation.col(0));
  rotation.col(1) = rotation.col(1) / rotation.col(1).norm();

  return rotation;
}